

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O1

void ans_msb_decompress(uint32_t *dst,size_t to_decode,uint8_t *cSrc,size_t cSrcSize)

{
  long *plVar1;
  uint32_t uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  array<unsigned_long,_4UL> states;
  ans_msb_decode ans_frame;
  uint8_t *local_b0;
  ulong local_a8;
  uint64_t local_a0 [4];
  ans_msb_decode local_80;
  
  local_b0 = cSrc;
  local_a8 = to_decode;
  ans_msb_decode::load(&local_80,cSrc);
  local_b0 = local_b0 + cSrcSize;
  lVar3 = 0;
  do {
    plVar1 = (long *)(local_b0 + -8);
    local_b0 = local_b0 + -8;
    local_a0[lVar3] = *plVar1 + local_80.lower_bound;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  uVar4 = 0;
  uVar5 = local_a8 & 0xfffffffffffffffc;
  if (uVar5 != 0) {
    do {
      uVar2 = ans_msb_decode::decode_sym(&local_80,local_a0,&local_b0);
      dst[uVar4] = uVar2;
      uVar2 = ans_msb_decode::decode_sym(&local_80,local_a0 + 1,&local_b0);
      dst[uVar4 + 1] = uVar2;
      uVar2 = ans_msb_decode::decode_sym(&local_80,local_a0 + 2,&local_b0);
      dst[uVar4 + 2] = uVar2;
      uVar2 = ans_msb_decode::decode_sym(&local_80,local_a0 + 3,&local_b0);
      dst[uVar4 + 3] = uVar2;
      uVar4 = uVar4 + 4;
    } while (uVar5 != uVar4);
  }
  if (uVar4 != local_a8) {
    do {
      uVar2 = ans_msb_decode::decode_sym(&local_80,local_a0 + 3,&local_b0);
      dst[uVar4] = uVar2;
      uVar4 = uVar4 + 1;
    } while (local_a8 != uVar4);
  }
  if (local_80.table.super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.table.super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.table.
                          super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.table.
                          super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ans_msb_decompress(
    uint32_t* dst, size_t to_decode, const uint8_t* cSrc, size_t cSrcSize)
{
    const uint32_t num_states = 4;
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_msb_decode::load(in_u8);
    in_u8 += cSrcSize;

    std::array<uint64_t, num_states> states;

    for (uint32_t i = 0; i < num_states; i++) {
        states[i] = ans_frame.init_state(in_u8);
    }

    size_t cur_idx = 0;
    auto out_u32 = reinterpret_cast<uint32_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % num_states);
    while (cur_idx != fast_decode) {
        out_u32[cur_idx] = ans_frame.decode_sym(states[0], in_u8);
        out_u32[cur_idx + 1] = ans_frame.decode_sym(states[1], in_u8);
        out_u32[cur_idx + 2] = ans_frame.decode_sym(states[2], in_u8);
        out_u32[cur_idx + 3] = ans_frame.decode_sym(states[3], in_u8);
        cur_idx += num_states;
    }
    while (cur_idx != to_decode) {
        out_u32[cur_idx++]
            = ans_frame.decode_sym(states[num_states - 1], in_u8);
    }
}